

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall ToggleButton::ToggleButton(ToggleButton *this,string *text)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)text);
  Button::Button(&this->super_Button,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Button).super_Widget._vptr_Widget = (_func_int **)&PTR__Button_0010f8b0;
  return;
}

Assistant:

ToggleButton::ToggleButton(std::string text) :
   Button(text)
{
}